

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

sub_form __thiscall
goodform::object_validator::at(object_validator *this,string *key,any *default_variant)

{
  const_iterator cVar1;
  sub_form sVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&this->value_->_M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->value_->_M_t)._M_impl.super__Rb_tree_header) {
    default_variant = (any *)(cVar1._M_node + 2);
  }
  sVar2.variant_ = default_variant;
  sVar2.error_ = this->error_;
  return sVar2;
}

Assistant:

sub_form object_validator::at(const std::string& key, const any& default_variant)
  {
    auto it = this->value_.find(key);
    sub_form ret(it != this->value_.end() ? it->second : default_variant, this->error_);
    return ret;
  }